

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiceDriver.cpp
# Opt level: O3

bool test_DiceRoller_getDiceRolled(void)

{
  DiceRoller *this;
  int x;
  int iVar1;
  vector<int,_std::allocator<int>_> local_30;
  
  this = (DiceRoller *)operator_new(0x10);
  DiceRoller::DiceRoller(this);
  iVar1 = 0;
  do {
    DiceRoller::roll(&local_30,this,iVar1);
    if (local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    iVar1 = iVar1 + 1;
  } while (iVar1 != 10);
  iVar1 = *this->diceRolled;
  DiceRoller::~DiceRoller(this);
  operator_delete(this,0x10);
  return iVar1 == 0x2d;
}

Assistant:

bool test_DiceRoller_getDiceRolled() {
    auto* roller = new DiceRoller();

    int rolls = 0;
    for (int x = 0; x < 10; x++) {
        rolls += x;
        roller->roll(x);
    }

    bool success = roller->getDiceRolled() == rolls;
    delete (roller);

    return success;
}